

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall
cmELFInternalImpl<cmELFTypes32>::ByteSwap(cmELFInternalImpl<cmELFTypes32> *this,ELF_Dyn *dyn)

{
  ELF_Dyn *dyn_local;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  cmELFByteSwap<int>(&dyn->d_tag);
  switch(dyn->d_tag) {
  case 0:
    break;
  case 1:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 2:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 3:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 4:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 5:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 6:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 7:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 8:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 9:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 10:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0xb:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0xc:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0xd:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0xe:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0xf:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x10:
    break;
  case 0x11:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x12:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x13:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x14:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x15:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x16:
    break;
  case 0x17:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x19:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x1a:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x1b:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x1c:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x1d:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x1e:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x20:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
    break;
  case 0x21:
    cmELFByteSwap<unsigned_int>(&(dyn->d_un).d_val);
  }
  return;
}

Assistant:

void ByteSwap(ELF_Dyn& dyn)
    {
    cmELFByteSwap(dyn.d_tag);
    switch (dyn.d_tag)
      {
      case DT_NULL:     /* dyn.d_un ignored */         break;
      case DT_NEEDED:   cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_PLTRELSZ: cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_PLTGOT:   cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_HASH:     cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_STRTAB:   cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_SYMTAB:   cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_RELA:     cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_RELASZ:   cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_RELAENT:  cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_STRSZ:    cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_SYMENT:   cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_INIT:     cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_FINI:     cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_SONAME:   cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_RPATH:    cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_SYMBOLIC: /* dyn.d_un ignored */         break;
      case DT_REL:      cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_RELSZ:    cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_RELENT:   cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_PLTREL:   cmELFByteSwap(dyn.d_un.d_val); break;
      case DT_DEBUG:    cmELFByteSwap(dyn.d_un.d_ptr); break;
      case DT_TEXTREL:  /* dyn.d_un ignored */         break;
      case DT_JMPREL:   cmELFByteSwap(dyn.d_un.d_ptr); break;
#ifdef T_BIND_NOW
      case T_BIND_NOW:         /* dyn.d_un ignored */         break;
#endif
#ifdef DT_INIT_ARRAY
      case DT_INIT_ARRAY:      cmELFByteSwap(dyn.d_un.d_ptr); break;
#endif
#ifdef DT_FINI_ARRAY
      case DT_FINI_ARRAY:      cmELFByteSwap(dyn.d_un.d_ptr); break;
#endif
#ifdef DT_INIT_ARRAYSZ
      case DT_INIT_ARRAYSZ:    cmELFByteSwap(dyn.d_un.d_val); break;
#endif
#ifdef DT_FINI_ARRAYSZ
      case DT_FINI_ARRAYSZ:    cmELFByteSwap(dyn.d_un.d_val); break;
#endif
#ifdef DT_RUNPATH
      case DT_RUNPATH:         cmELFByteSwap(dyn.d_un.d_val); break;
#endif
#ifdef DT_FLAGS
      case DT_FLAGS:           cmELFByteSwap(dyn.d_un.d_val); break;
#endif
#ifdef DT_PREINIT_ARRAY
      case DT_PREINIT_ARRAY:   cmELFByteSwap(dyn.d_un.d_ptr); break;
#endif
#ifdef DT_PREINIT_ARRAYSZ
      case DT_PREINIT_ARRAYSZ: cmELFByteSwap(dyn.d_un.d_val); break;
#endif
      }
    }